

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkAllocationCallbackUtil.cpp
# Opt level: O3

ostream * vk::operator<<(ostream *str,AllocationCallbackRecord *record)

{
  ostream *poVar1;
  long lVar2;
  char *pcVar3;
  bool bVar4;
  Hex<16UL> local_28;
  
  switch(record->type) {
  case TYPE_ALLOCATION:
    std::__ostream_insert<char,std::char_traits<char>>(str,"ALLOCATION: size=",0x11);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)str);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", alignment=",0xc);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", scope=",8);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(record->data).allocation.scope);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", returnedPtr=",0xe);
    local_28.value = (deUint64)(record->data).allocation.returnedPtr;
    break;
  case TYPE_REALLOCATION:
    std::__ostream_insert<char,std::char_traits<char>>(str,"REALLOCATION: original=",0x17);
    local_28.value = (record->data).allocation.size;
    poVar1 = tcu::Format::Hex<16UL>::toStream(&local_28,str);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", size=",7);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", alignment=",0xc);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", scope=",8);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(record->data).reallocation.scope);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", returnedPtr=",0xe);
    local_28.value = (deUint64)(record->data).reallocation.returnedPtr;
    break;
  case TYPE_FREE:
    std::__ostream_insert<char,std::char_traits<char>>(str,"FREE: mem=",10);
    local_28.value = (record->data).allocation.size;
    poVar1 = str;
    break;
  case TYPE_INTERNAL_ALLOCATION:
  case TYPE_INTERNAL_FREE:
    std::__ostream_insert<char,std::char_traits<char>>(str,"INTERNAL_",9);
    bVar4 = record->type == TYPE_INTERNAL_ALLOCATION;
    pcVar3 = "FREE";
    if (bVar4) {
      pcVar3 = "ALLOCATION";
    }
    lVar2 = 4;
    if (bVar4) {
      lVar2 = 10;
    }
    std::__ostream_insert<char,std::char_traits<char>>(str,pcVar3,lVar2);
    std::__ostream_insert<char,std::char_traits<char>>(str,": size=",7);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)str);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", type=",7);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(record->data).internalAllocation.type);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", scope=",8);
    std::ostream::operator<<(poVar1,(record->data).internalAllocation.scope);
  default:
    goto switchD_00a11598_default;
  }
  tcu::Format::Hex<16UL>::toStream(&local_28,poVar1);
switchD_00a11598_default:
  return str;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const AllocationCallbackRecord& record)
{
	switch (record.type)
	{
		case AllocationCallbackRecord::TYPE_ALLOCATION:
			str << "ALLOCATION: size=" << record.data.allocation.size
				<< ", alignment=" << record.data.allocation.alignment
				<< ", scope=" << record.data.allocation.scope
				<< ", returnedPtr=" << tcu::toHex(record.data.allocation.returnedPtr);
			break;

		case AllocationCallbackRecord::TYPE_REALLOCATION:
			str << "REALLOCATION: original=" << tcu::toHex(record.data.reallocation.original)
				<< ", size=" << record.data.reallocation.size
				<< ", alignment=" << record.data.reallocation.alignment
				<< ", scope=" << record.data.reallocation.scope
				<< ", returnedPtr=" << tcu::toHex(record.data.reallocation.returnedPtr);
			break;

		case AllocationCallbackRecord::TYPE_FREE:
			str << "FREE: mem=" << tcu::toHex(record.data.free.mem);
			break;

		case AllocationCallbackRecord::TYPE_INTERNAL_ALLOCATION:
		case AllocationCallbackRecord::TYPE_INTERNAL_FREE:
			str << "INTERNAL_" << (record.type == AllocationCallbackRecord::TYPE_INTERNAL_ALLOCATION ? "ALLOCATION" : "FREE")
				<< ": size=" << record.data.internalAllocation.size
				<< ", type=" << record.data.internalAllocation.type
				<< ", scope=" << record.data.internalAllocation.scope;
			break;

		default:
			DE_ASSERT(false);
	}

	return str;
}